

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtCheckDsdAnd(word t,int i,int j,word *pOut)

{
  word wVar1;
  word wVar2;
  word wVar3;
  word wVar4;
  word c11;
  word c10;
  word c01;
  word c00;
  word c1;
  word c0;
  word *pOut_local;
  int j_local;
  int i_local;
  word t_local;
  
  wVar1 = Abc_Tt6Cofactor0(t,i);
  wVar2 = Abc_Tt6Cofactor1(t,i);
  wVar3 = Abc_Tt6Cofactor0(wVar1,j);
  wVar1 = Abc_Tt6Cofactor1(wVar1,j);
  wVar4 = Abc_Tt6Cofactor0(wVar2,j);
  wVar2 = Abc_Tt6Cofactor1(wVar2,j);
  if ((wVar3 == wVar1) && (wVar3 == wVar4)) {
    if (pOut != (word *)0x0) {
      *pOut = (s_Truths6[i] ^ 0xffffffffffffffff) & wVar3 | s_Truths6[i] & wVar2;
    }
    t_local._4_4_ = 0;
  }
  else if ((wVar2 == wVar3) && (wVar2 == wVar4)) {
    if (pOut != (word *)0x0) {
      *pOut = (s_Truths6[i] ^ 0xffffffffffffffff) & wVar2 | s_Truths6[i] & wVar1;
    }
    t_local._4_4_ = 1;
  }
  else if ((wVar2 == wVar3) && (wVar2 == wVar1)) {
    if (pOut != (word *)0x0) {
      *pOut = (s_Truths6[i] ^ 0xffffffffffffffff) & wVar2 | s_Truths6[i] & wVar4;
    }
    t_local._4_4_ = 2;
  }
  else if ((wVar2 == wVar1) && (wVar2 == wVar4)) {
    if (pOut != (word *)0x0) {
      *pOut = (s_Truths6[i] ^ 0xffffffffffffffff) & wVar2 | s_Truths6[i] & wVar3;
    }
    t_local._4_4_ = 3;
  }
  else if ((wVar3 == wVar2) && (wVar1 == wVar4)) {
    if (pOut != (word *)0x0) {
      *pOut = (s_Truths6[i] ^ 0xffffffffffffffff) & wVar2 | s_Truths6[i] & wVar4;
    }
    t_local._4_4_ = 4;
  }
  else {
    t_local._4_4_ = -1;
  }
  return t_local._4_4_;
}

Assistant:

static inline int Abc_TtCheckDsdAnd( word t, int i, int j, word * pOut )
{
    word c0 = Abc_Tt6Cofactor0( t, i );
    word c1 = Abc_Tt6Cofactor1( t, i );
    word c00 = Abc_Tt6Cofactor0( c0, j );
    word c01 = Abc_Tt6Cofactor1( c0, j );
    word c10 = Abc_Tt6Cofactor0( c1, j );
    word c11 = Abc_Tt6Cofactor1( c1, j );
    if ( c00 == c01 && c00 == c10 ) //  i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c00) | (s_Truths6[i] & c11);
        return 0;
    }
    if ( c11 == c00 && c11 == c10 ) //  i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c01);
        return 1;
    }
    if ( c11 == c00 && c11 == c01 ) // !i *  j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 2;
    }
    if ( c11 == c01 && c11 == c10 ) // !i * !j
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c00);
        return 3;
    }
    if ( c00 == c11 && c01 == c10 )
    {
        if ( pOut ) *pOut = (~s_Truths6[i] & c11) | (s_Truths6[i] & c10);
        return 4;
    }
    return -1;
}